

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O0

void __thiscall Clasp::SatPreprocessor::freezeSeen(SatPreprocessor *this)

{
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  long in_RDI;
  SharedContext *unaff_retaddr;
  Var v;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  long lVar4;
  
  lVar4 = in_RDI;
  bVar1 = SharedContext::validVar
                    ((SharedContext *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                     (Var)((ulong)in_RDI >> 0x20));
  if (!bVar1) {
    *(undefined4 *)(in_RDI + 0x50) = 1;
  }
  bVar1 = SharedContext::validVar
                    ((SharedContext *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                     (Var)((ulong)in_RDI >> 0x20));
  if (!bVar1) {
    uVar2 = SharedContext::numVars((SharedContext *)0x1d13de);
    *(uint32 *)(in_RDI + 0x54) = uVar2 + 1;
  }
  for (iVar3 = *(int *)(in_RDI + 0x50); iVar3 != *(int *)(in_RDI + 0x54); iVar3 = iVar3 + 1) {
    bVar1 = SharedContext::eliminated
                      ((SharedContext *)CONCAT44(iVar3,in_stack_fffffffffffffff0),
                       (Var)((ulong)in_RDI >> 0x20));
    if (!bVar1) {
      SharedContext::setFrozen
                (unaff_retaddr,(Var)((ulong)lVar4 >> 0x20),SUB81((ulong)lVar4 >> 0x18,0));
    }
  }
  *(undefined4 *)(in_RDI + 0x50) = *(undefined4 *)(in_RDI + 0x54);
  return;
}

Assistant:

void SatPreprocessor::freezeSeen() {
	if (!ctx_->validVar(seen_.lo)) { seen_.lo = 1; }
	if (!ctx_->validVar(seen_.hi)) { seen_.hi = ctx_->numVars() + 1; }
	for (Var v = seen_.lo; v != seen_.hi; ++v) {
		if (!ctx_->eliminated(v)) { ctx_->setFrozen(v, true); }
	}
	seen_.lo = seen_.hi;
}